

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O1

int vx__triangle_box_overlap(vx_vertex_t boxcenter,vx_vertex_t halfboxsize,vx_triangle_t triangle)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  anon_union_12_2_12391dad_for_vx_vertex_0 local_10;
  
  local_b8.v[2] = (float)halfboxsize.field_0._8_4_;
  fVar9 = boxcenter.field_0._8_4_;
  fVar13 = boxcenter.field_0._0_4_;
  fVar14 = boxcenter.field_0._4_4_;
  fVar5 = triangle.p1.field_0.v[1] - fVar14;
  fVar24 = triangle.p1.field_0.v[2] - fVar9;
  fVar12 = triangle.p2.field_0.v[1] - fVar14;
  fVar10 = triangle.p2.field_0.v[2] - fVar9;
  fVar14 = triangle.p3.field_0.v[1] - fVar14;
  fVar9 = triangle.p3.field_0.v[2] - fVar9;
  fVar15 = fVar12 - fVar5;
  fVar11 = fVar10 - fVar24;
  fVar16 = fVar11 * fVar5 - fVar24 * fVar15;
  fVar21 = fVar11 * fVar14 - fVar9 * fVar15;
  local_b8.v[1] = halfboxsize.field_0._4_4_;
  fVar3 = ABS(fVar11) * local_b8.v[1] + ABS(fVar15) * local_b8.v[2];
  fVar7 = fVar16;
  if (fVar21 <= fVar16) {
    fVar7 = fVar21;
  }
  iVar1 = 0;
  iVar2 = 0;
  if (fVar7 <= fVar3) {
    if (fVar21 <= fVar16) {
      fVar21 = fVar16;
    }
    iVar2 = iVar1;
    if (-fVar3 <= fVar21) {
      local_a8 = ZEXT416((uint)local_b8.v[1]);
      fVar4 = triangle.p1.field_0.v[0] - fVar13;
      fVar21 = triangle.p2.field_0.v[0] - fVar13;
      fVar13 = triangle.p3.field_0.v[0] - fVar13;
      fVar17 = fVar21 - fVar4;
      fVar16 = fVar24 * fVar17 - fVar11 * fVar4;
      local_48 = ZEXT416((uint)fVar17);
      fVar3 = fVar17 * fVar9 - fVar11 * fVar13;
      fVar7 = fVar16;
      if (fVar3 <= fVar16) {
        fVar7 = fVar3;
      }
      local_b8.v[0] = halfboxsize.field_0._0_4_;
      fVar6 = ABS(fVar11) * local_b8.v[0] + ABS(fVar17) * local_b8.v[2];
      if (fVar7 <= fVar6) {
        if (fVar3 <= fVar16) {
          fVar3 = fVar16;
        }
        if (-fVar6 <= fVar3) {
          fVar7 = fVar15 * fVar21 - fVar12 * fVar17;
          fVar16 = fVar15 * fVar13 - fVar14 * fVar17;
          fVar3 = fVar16;
          if (fVar7 <= fVar16) {
            fVar3 = fVar7;
          }
          local_98 = ZEXT416((uint)local_b8.v[0]);
          fVar6 = ABS(fVar15) * local_b8.v[0] + ABS(fVar17) * local_b8.v[1];
          if (fVar3 <= fVar6) {
            if (fVar7 <= fVar16) {
              fVar7 = fVar16;
            }
            if (-fVar6 <= fVar7) {
              fVar22 = fVar14 - fVar12;
              fVar6 = fVar9 - fVar10;
              fVar16 = fVar6 * fVar5 - fVar24 * fVar22;
              local_58 = ZEXT416((uint)fVar6);
              fVar3 = fVar6 * fVar14 - fVar9 * fVar22;
              fVar18 = ABS(fVar6) * local_b8.v[1] + ABS(fVar22) * local_b8.v[2];
              fVar7 = fVar16;
              if (fVar3 <= fVar16) {
                fVar7 = fVar3;
              }
              if (fVar7 <= fVar18) {
                if (fVar3 <= fVar16) {
                  fVar3 = fVar16;
                }
                if (-fVar18 <= fVar3) {
                  local_68 = ZEXT416((uint)fVar22);
                  fVar18 = fVar13 - fVar21;
                  fVar16 = fVar24 * fVar18 - fVar6 * fVar4;
                  local_78 = ZEXT416((uint)fVar18);
                  fVar3 = fVar18 * fVar9 - fVar6 * fVar13;
                  fVar7 = fVar16;
                  if (fVar3 <= fVar16) {
                    fVar7 = fVar3;
                  }
                  fVar8 = ABS(fVar6) * local_b8.v[0] + ABS(fVar18) * local_b8.v[2];
                  if (fVar7 <= fVar8) {
                    if (fVar3 <= fVar16) {
                      fVar3 = fVar16;
                    }
                    if (-fVar8 <= fVar3) {
                      fVar16 = fVar22 * fVar4 - fVar5 * fVar18;
                      fVar7 = fVar22 * fVar21 - fVar12 * fVar18;
                      fVar3 = fVar16;
                      if (fVar7 <= fVar16) {
                        fVar3 = fVar7;
                      }
                      fVar8 = ABS(fVar22) * local_b8.v[0] + ABS(fVar18) * local_b8.v[1];
                      if (fVar3 <= fVar8) {
                        if (fVar7 <= fVar16) {
                          fVar7 = fVar16;
                        }
                        if (-fVar8 <= fVar7) {
                          fVar19 = fVar5 - fVar14;
                          fVar8 = fVar24 - fVar9;
                          fVar23 = ABS(fVar19);
                          fVar16 = fVar8 * fVar5 - fVar24 * fVar19;
                          local_28 = ZEXT416((uint)fVar19);
                          fVar3 = fVar8 * fVar12 - fVar10 * fVar19;
                          local_38 = ZEXT416((uint)fVar23);
                          fVar20 = ABS(fVar8) * local_b8.v[1] + fVar23 * local_b8.v[2];
                          fVar7 = fVar16;
                          if (fVar3 <= fVar16) {
                            fVar7 = fVar3;
                          }
                          if (fVar7 <= fVar20) {
                            if (fVar3 <= fVar16) {
                              fVar3 = fVar16;
                            }
                            if (-fVar20 <= fVar3) {
                              fVar16 = fVar4 - fVar13;
                              fVar20 = fVar24 * fVar16 - fVar8 * fVar4;
                              fVar3 = fVar10 * fVar16 - fVar8 * fVar21;
                              fVar7 = fVar20;
                              if (fVar3 <= fVar20) {
                                fVar7 = fVar3;
                              }
                              fVar8 = ABS(fVar8) * local_b8.v[0] + ABS(fVar16) * local_b8.v[2];
                              if (fVar7 <= fVar8) {
                                if (fVar3 <= fVar20) {
                                  fVar3 = fVar20;
                                }
                                if (-fVar8 <= fVar3) {
                                  fVar7 = fVar19 * fVar21 - fVar12 * fVar16;
                                  fVar8 = fVar19 * fVar13 - fVar16 * fVar14;
                                  fVar3 = fVar8;
                                  if (fVar7 <= fVar8) {
                                    fVar3 = fVar7;
                                  }
                                  fVar16 = fVar23 * local_b8.v[0] + ABS(fVar16) * local_b8.v[1];
                                  if (fVar3 <= fVar16) {
                                    if (fVar7 <= fVar8) {
                                      fVar7 = fVar8;
                                    }
                                    if (-fVar16 <= fVar7) {
                                      fVar7 = fVar21;
                                      if (fVar4 <= fVar21) {
                                        fVar7 = fVar4;
                                      }
                                      fVar3 = fVar13;
                                      if (fVar7 <= fVar13) {
                                        fVar3 = fVar7;
                                      }
                                      if (fVar3 <= local_b8.v[0]) {
                                        if (fVar21 <= fVar4) {
                                          fVar21 = fVar4;
                                        }
                                        if (fVar13 <= fVar21) {
                                          fVar13 = fVar21;
                                        }
                                        if (-local_b8.v[0] <= fVar13) {
                                          fVar7 = fVar12;
                                          if (fVar5 <= fVar12) {
                                            fVar7 = fVar5;
                                          }
                                          fVar13 = fVar14;
                                          if (fVar7 <= fVar14) {
                                            fVar13 = fVar7;
                                          }
                                          if (fVar13 <= local_b8.v[1]) {
                                            if (fVar12 <= fVar5) {
                                              fVar12 = fVar5;
                                            }
                                            if (fVar14 <= fVar12) {
                                              fVar14 = fVar12;
                                            }
                                            if (-local_b8.v[1] <= fVar14) {
                                              fVar7 = fVar10;
                                              if (fVar24 <= fVar10) {
                                                fVar7 = fVar24;
                                              }
                                              fVar13 = fVar9;
                                              if (fVar7 <= fVar9) {
                                                fVar13 = fVar7;
                                              }
                                              if (fVar13 <= local_b8.v[2]) {
                                                if (fVar10 <= fVar24) {
                                                  fVar10 = fVar24;
                                                }
                                                if (fVar9 <= fVar10) {
                                                  fVar9 = fVar10;
                                                }
                                                if (-local_b8.v[2] <= fVar9) {
                                                  fVar13 = fVar15 * fVar6 + -fVar11 * fVar22;
                                                  fVar7 = fVar11 * fVar18 + -fVar17 * fVar6;
                                                  local_10.v[2] = fVar17 * fVar22 + -fVar15 * fVar18
                                                  ;
                                                  local_10._0_8_ = CONCAT44(fVar7,fVar13);
                                                  local_b8._0_8_ = halfboxsize.field_0._0_8_;
                                                  local_88 = local_b8.v[2];
                                                  iVar2 = vx__plane_box_overlap
                                                                    ((vx_vertex_t *)
                                                                     &local_10.field_1,
                                                                     -(local_10.v[2] * fVar24 +
                                                                      fVar4 * fVar13 + fVar5 * fVar7
                                                                      ),(vx_vertex_t *)
                                                                        &local_b8.field_1);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int vx__triangle_box_overlap(vx_vertex_t boxcenter,
    vx_vertex_t halfboxsize,
    vx_triangle_t triangle)
{
    vx_vertex_t v1, v2, v3, normal, e1, e2, e3;
    float min, max, d, p1, p2, p3, rad, fex, fey, fez;

    v1 = triangle.p1;
    v2 = triangle.p2;
    v3 = triangle.p3;

    vx__vertex_sub(&v1, &boxcenter);
    vx__vertex_sub(&v2, &boxcenter);
    vx__vertex_sub(&v3, &boxcenter);

    e1 = v2;
    e2 = v3;
    e3 = v1;

    vx__vertex_sub(&e1, &v1);
    vx__vertex_sub(&e2, &v2);
    vx__vertex_sub(&e3, &v3);

    fex = fabs(e1.x);
    fey = fabs(e1.y);
    fez = fabs(e1.z);

    AXISTEST_X01(e1.z, e1.y, fez, fey);
    AXISTEST_Y02(e1.z, e1.x, fez, fex);
    AXISTEST_Z12(e1.y, e1.x, fey, fex);

    fex = fabs(e2.x);
    fey = fabs(e2.y);
    fez = fabs(e2.z);

    AXISTEST_X01(e2.z, e2.y, fez, fey);
    AXISTEST_Y02(e2.z, e2.x, fez, fex);
    AXISTEST_Z0(e2.y, e2.x, fey, fex);

    fex = fabs(e3.x);
    fey = fabs(e3.y);
    fez = fabs(e3.z);

    AXISTEST_X2(e3.z, e3.y, fez, fey);
    AXISTEST_Y1(e3.z, e3.x, fez, fex);
    AXISTEST_Z12(e3.y, e3.x, fey, fex);

    VX_FINDMINMAX(v1.x, v2.x, v3.x, min, max);
    if (min > halfboxsize.x || max < -halfboxsize.x) {
        return false;
    }

    VX_FINDMINMAX(v1.y, v2.y, v3.y, min, max);
    if (min > halfboxsize.y || max < -halfboxsize.y) {
        return false;
    }

    VX_FINDMINMAX(v1.z, v2.z, v3.z, min, max);
    if (min > halfboxsize.z || max < -halfboxsize.z) {
        return false;
    }

    normal = vx__vertex_cross(&e1, &e2);
    d = -vx__vertex_dot(&normal, &v1);

    if (!vx__plane_box_overlap(&normal, d, &halfboxsize)) {
        return false;
    }

    return true;
}